

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::setComment(Value *this,String *comment,CommentPlacement placement)

{
  OStringStream oss;
  String SStack_1d8;
  String local_1b8;
  ostringstream local_198 [376];
  
  if (comment->_M_string_length != 0) {
    if ((comment->_M_dataplus)._M_p[comment->_M_string_length - 1] == '\n') {
      std::__cxx11::string::pop_back();
      if (comment->_M_string_length == 0) goto LAB_0012a97c;
    }
    if (*(comment->_M_dataplus)._M_p != '/') {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::operator<<((ostream *)local_198,
                      "in Json::Value::setComment(): Comments must start with /");
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1b8);
    }
  }
LAB_0012a97c:
  std::__cxx11::string::string((string *)&SStack_1d8,(string *)comment);
  Comments::set(&this->comments_,placement,&SStack_1d8);
  std::__cxx11::string::~string((string *)&SStack_1d8);
  return;
}

Assistant:

void Value::setComment(String comment, CommentPlacement placement) {
  if (!comment.empty() && (comment.back() == '\n')) {
    // Always discard trailing newline, to aid indentation.
    comment.pop_back();
  }
  JSON_ASSERT_MESSAGE(
      comment.empty() || comment[0] == '/',
      "in Json::Value::setComment(): Comments must start with /");
  comments_.set(placement, std::move(comment));
}